

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> *
kj::
newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
          (void)

{
  RefOrVoid<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>
  params;
  Own<kj::_::PromiseNode> *pOVar1;
  ConnectionCounter *pCVar2;
  Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> *pPVar3;
  Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>
  *other;
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *in_RDI;
  void *local_68;
  undefined1 local_60 [8];
  ReducePromises<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  promise;
  Own<kj::_::AdapterPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_kj::_::PromiseAndFulfillerAdapter<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>_>
  local_40;
  undefined1 local_30 [8];
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>
  wrapper;
  
  _::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>::
  make();
  params = Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>
           ::operator*((Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>
                        *)&intermediate.ptr);
  heap<kj::_::AdapterPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::_::PromiseAndFulfillerAdapter<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>>,kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>&>
            ((kj *)&local_40,params);
  Own<kj::_::PromiseNode>::
  Own<kj::_::AdapterPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::_::PromiseAndFulfillerAdapter<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>>,void>
            ((Own<kj::_::PromiseNode> *)local_30,&local_40);
  Own<kj::_::AdapterPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_kj::_::PromiseAndFulfillerAdapter<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>_>
  ::~Own(&local_40);
  pOVar1 = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)local_30);
  local_68 = (void *)0x0;
  pCVar2 = implicitCast<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter*,decltype(nullptr)>
                     (&local_68);
  pOVar1 = _::
           maybeChain<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                     (pOVar1,pCVar2);
  Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>::Promise
            ((Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> *
             )local_60,false,pOVar1);
  pPVar3 = mv<kj::Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>>
                     ((Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                       *)local_60);
  Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>::Promise
            (&in_RDI->promise,pPVar3);
  other = mv<kj::Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>>>
                    ((Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>
                      *)&intermediate.ptr);
  Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>>
  ::
  Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,void>
            ((Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>>
              *)&in_RDI->fulfiller,other);
  Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>::~Promise
            ((Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> *
             )local_60);
  Own<kj::_::PromiseNode>::~Own((Own<kj::_::PromiseNode> *)local_30);
  Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>
  ::~Own((Own<kj::_::WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>
          *)&intermediate.ptr);
  return in_RDI;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller() {
  auto wrapper = _::WeakFulfiller<T>::make();

  Own<_::PromiseNode> intermediate(
      heap<_::AdapterPromiseNode<_::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  _::ReducePromises<T> promise(false,
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr)));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}